

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub>::BinaryVecOp
          (BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  bool bVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  VariableType *pVVar6;
  ShaderParameters *pSVar7;
  Random *pRVar8;
  float *aMin;
  float *aMax;
  float *bMin;
  float *bMax;
  int *aMin_00;
  int *aMax_00;
  int *bMin_00;
  int *bMax_00;
  bool *pbVar9;
  bool *pbVar10;
  bool *pbVar11;
  bool *pbVar12;
  float dstMin;
  float dstMax;
  StridedValueRead<1> SVar13;
  ConstValueAccess CVar14;
  ConstStridedValueAccess<1> CVar15;
  Scalar *in_stack_fffffffffffff780;
  ConstStridedValueAccess<1> local_5c0;
  ConstStridedValueAccess<1> local_5b0;
  ConstStridedValueAccess<1> local_5a0;
  ConstStridedValueAccess<1> local_590;
  ConstValueAccess local_580;
  ConstValueAccess local_570;
  ComputeSubRange local_559;
  ConstStridedValueAccess<1> local_558;
  ConstStridedValueAccess<1> local_548;
  ConstStridedValueAccess<1> local_538;
  ConstStridedValueAccess<1> local_528;
  ConstValueAccess local_518;
  ConstValueAccess local_508;
  ComputeSubRange local_4f1;
  ConstStridedValueAccess<1> local_4f0;
  ConstStridedValueAccess<1> local_4e0;
  ConstStridedValueAccess<1> local_4d0;
  ConstStridedValueAccess<1> local_4c0;
  ConstValueAccess local_4b0;
  ConstValueAccess local_4a0;
  ComputeSubRange local_489;
  ConstStridedValueAccess<1> local_488;
  ConstValueAccess local_478;
  StridedValueRead<1> local_468;
  ConstStridedValueAccess<1> local_458;
  ConstValueAccess local_448;
  StridedValueRead<1> local_438;
  ConstStridedValueAccess<1> local_428;
  ConstValueAccess local_418;
  StridedValueRead<1> local_408;
  ConstStridedValueAccess<1> local_3f8;
  ConstValueAccess local_3e8;
  StridedValueRead<1> local_3d8;
  VariableType *local_3c8;
  VariableType *pVStack_3c0;
  Scalar *local_3b8;
  ValueRangeAccess local_3a8;
  undefined1 local_390 [8];
  ValueRangeAccess b;
  undefined1 local_360 [8];
  ValueRangeAccess a;
  ValueRangeAccess local_330;
  undefined1 auStack_318 [8];
  ConstValueRangeAccess dst;
  int local_2f8;
  int elemNdx;
  Type baseType;
  ValueRange local_270;
  ValueRangeAccess local_1f0;
  VariableType local_1d8;
  ValueRange local_188;
  int local_104;
  iterator iStack_100;
  int numElements;
  __normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
  local_f8;
  Type local_ec;
  value_type local_e8;
  Type baseType_1;
  undefined1 local_e0 [8];
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> baseTypes;
  int availableLevels;
  undefined1 local_a0 [8];
  ValueRange valueRange;
  Type operatorToken_local;
  GeneratorState *state_local;
  BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub> *this_local;
  
  valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = operatorToken;
  BinaryOp<5,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<5,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<5,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryVecOp_00cc0038;
  ValueRange::ValueRange((ValueRange *)local_a0,inValueRange);
  pVVar6 = ValueRange::getType((ValueRange *)local_a0);
  bVar1 = VariableType::isVoid(pVVar6);
  if (bVar1) {
    pSVar7 = GeneratorState::getShaderParameters(state);
    iVar4 = pSVar7->maxExpressionDepth;
    iVar5 = GeneratorState::getExpressionDepth(state);
    baseTypes.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar4 - iVar5;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::vector
              ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)local_e0
              );
    baseType_1 = TYPE_FLOAT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::push_back
              ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)local_e0
               ,&baseType_1);
    local_e8 = TYPE_INT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::push_back
              ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)local_e0
               ,&local_e8);
    pRVar8 = GeneratorState::getRandom(state);
    local_f8._M_current =
         (Type *)std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
                 begin((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)
                       local_e0);
    iStack_100 = std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::end
                           ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                             *)local_e0);
    local_ec = de::Random::
               choose<rsg::VariableType::Type,__gnu_cxx::__normal_iterator<rsg::VariableType::Type*,std::vector<rsg::VariableType::Type,std::allocator<rsg::VariableType::Type>>>>
                         (pRVar8,local_f8,
                          (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                           )iStack_100._M_current);
    pRVar8 = GeneratorState::getRandom(state);
    local_104 = de::Random::getInt(pRVar8,1,(uint)(2 < (int)baseTypes.
                                                                                                                        
                                                  super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) * 3 + 1);
    VariableType::VariableType(&local_1d8,local_ec,local_104);
    ValueRange::ValueRange(&local_188,&local_1d8);
    ValueRange::operator=((ValueRange *)local_a0,&local_188);
    ValueRange::~ValueRange(&local_188);
    VariableType::~VariableType(&local_1d8);
    ValueRange::asAccess(&local_1f0,(ValueRange *)local_a0);
    valueRange_00.super_ConstValueRangeAccess.m_min = local_1f0.super_ConstValueRangeAccess.m_min;
    valueRange_00.super_ConstValueRangeAccess.m_type = local_1f0.super_ConstValueRangeAccess.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_1f0.super_ConstValueRangeAccess.m_max;
    computeRandomValueRange(state,valueRange_00);
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::~vector
              ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)local_e0
              );
  }
  pVVar6 = ValueRange::getType((ValueRange *)local_a0);
  VariableType::operator=(&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type,pVVar6);
  ValueStorage<64>::setStorage
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_value,
             &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type);
  ValueRange::ValueRange(&local_270,&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type);
  ValueRange::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange,&local_270);
  ValueRange::~ValueRange(&local_270);
  ValueRange::ValueRange
            ((ValueRange *)&elemNdx,&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type);
  ValueRange::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange,
             (ValueRange *)&elemNdx);
  ValueRange::~ValueRange((ValueRange *)&elemNdx);
  TVar3 = VariableType::getBaseType(&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type);
  local_2f8 = 0;
  do {
    iVar4 = VariableType::getNumElements(&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type);
    if (iVar4 <= local_2f8) {
      ValueRange::~ValueRange((ValueRange *)local_a0);
      return;
    }
    ValueRange::asAccess
              ((ValueRangeAccess *)&a.super_ConstValueRangeAccess.m_max,(ValueRange *)local_a0);
    ValueRangeAccess::component
              (&local_330,(ValueRangeAccess *)&a.super_ConstValueRangeAccess.m_max,local_2f8);
    dst.m_min = local_330.super_ConstValueRangeAccess.m_max;
    auStack_318 = (undefined1  [8])local_330.super_ConstValueRangeAccess.m_type;
    dst.m_type = (VariableType *)local_330.super_ConstValueRangeAccess.m_min;
    ValueRange::asAccess
              ((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max,
               &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange);
    ValueRangeAccess::component
              ((ValueRangeAccess *)local_360,
               (ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max,local_2f8);
    ValueRange::asAccess
              (&local_3a8,&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange);
    ValueRangeAccess::component((ValueRangeAccess *)local_390,&local_3a8,local_2f8);
    if ((TVar3 == TYPE_FLOAT) || (TVar3 == TYPE_INT)) {
      local_3b8 = dst.m_min;
      local_3c8 = (VariableType *)auStack_318;
      pVStack_3c0 = dst.m_type;
      valueRange_01.m_min = dst.m_min;
      valueRange_01.m_type = dst.m_type;
      valueRange_01.m_max = in_stack_fffffffffffff780;
      bVar1 = isUndefinedValueRange(valueRange_01);
      if (!bVar1) goto LAB_00a0098c;
      CVar14 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)auStack_318);
      local_3e8 = CVar14;
      SVar13 = ConstStridedValueAccess<1>::value(&local_3e8);
      local_3d8 = SVar13;
      CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_360);
      local_3f8 = CVar15;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_3f8,&local_3d8);
      CVar14 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)auStack_318);
      local_418 = CVar14;
      SVar13 = ConstStridedValueAccess<1>::value(&local_418);
      local_408 = SVar13;
      CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_390);
      local_428 = CVar15;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_428,&local_408);
      CVar14 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)auStack_318);
      local_448 = CVar14;
      SVar13 = ConstStridedValueAccess<1>::value(&local_448);
      local_438 = SVar13;
      CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_360);
      local_458 = CVar15;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_458,&local_438);
      CVar14 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)auStack_318);
      local_478 = CVar14;
      SVar13 = ConstStridedValueAccess<1>::value(&local_478);
      local_468 = SVar13;
      CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_390);
      local_488 = CVar15;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_488,&local_468);
    }
    else {
LAB_00a0098c:
      if (TVar3 == TYPE_FLOAT) {
        pRVar8 = GeneratorState::getRandom(state);
        CVar14 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)auStack_318);
        local_4a0 = CVar14;
        dstMin = ConstStridedValueAccess<1>::asFloat(&local_4a0);
        CVar14 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)auStack_318);
        local_4b0 = CVar14;
        dstMax = ConstStridedValueAccess<1>::asFloat(&local_4b0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_360)
        ;
        local_4c0 = CVar15;
        aMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_4c0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_360)
        ;
        local_4d0 = CVar15;
        aMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_4d0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_390)
        ;
        local_4e0 = CVar15;
        bMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_4e0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_390)
        ;
        local_4f0 = CVar15;
        bMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_4f0);
        ComputeSubRange::operator()(&local_489,pRVar8,dstMin,dstMax,aMin,aMax,bMin,bMax);
      }
      else if (TVar3 == TYPE_INT) {
        pRVar8 = GeneratorState::getRandom(state);
        CVar14 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)auStack_318);
        local_508 = CVar14;
        iVar4 = ConstStridedValueAccess<1>::asInt(&local_508);
        CVar14 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)auStack_318);
        local_518 = CVar14;
        iVar5 = ConstStridedValueAccess<1>::asInt(&local_518);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_360)
        ;
        local_528 = CVar15;
        aMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_528);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_360)
        ;
        local_538 = CVar15;
        aMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_538);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_390)
        ;
        local_548 = CVar15;
        bMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_548);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_390)
        ;
        local_558 = CVar15;
        bMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_558);
        ComputeSubRange::operator()(&local_4f1,pRVar8,iVar4,iVar5,aMin_00,aMax_00,bMin_00,bMax_00);
      }
      else {
        pRVar8 = GeneratorState::getRandom(state);
        CVar14 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)auStack_318);
        local_570 = CVar14;
        bVar1 = ConstStridedValueAccess<1>::asBool(&local_570);
        CVar14 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)auStack_318);
        local_580 = CVar14;
        bVar2 = ConstStridedValueAccess<1>::asBool(&local_580);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_360)
        ;
        local_590 = CVar15;
        pbVar9 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_590);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_360)
        ;
        local_5a0 = CVar15;
        pbVar10 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_5a0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_390)
        ;
        local_5b0 = CVar15;
        pbVar11 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_5b0);
        CVar15 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_390)
        ;
        local_5c0 = CVar15;
        pbVar12 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_5c0);
        ComputeSubRange::operator()(&local_559,pRVar8,bVar1,bVar2,pbVar9,pbVar10,pbVar11,pbVar12);
      }
    }
    local_2f8 = local_2f8 + 1;
  } while( true );
}

Assistant:

BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::BinaryVecOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<Precedence, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		int							availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
		vector<VariableType::Type>	baseTypes;

		if (Float)	baseTypes.push_back(VariableType::TYPE_FLOAT);
		if (Int)	baseTypes.push_back(VariableType::TYPE_INT);
		if (Bool)	baseTypes.push_back(VariableType::TYPE_BOOL);

		VariableType::Type	baseType	= state.getRandom().choose<VariableType::Type>(baseTypes.begin(), baseTypes.end());
		int					numElements	= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

		valueRange = ValueRange(VariableType(baseType, numElements));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Initialize storage for value ranges
	this->m_rightValueRange	= ValueRange(this->m_type);
	this->m_leftValueRange	= ValueRange(this->m_type);

	VariableType::Type baseType = this->m_type.getBaseType();

	// Compute range for b that satisfies requested value range
	for (int elemNdx = 0; elemNdx < this->m_type.getNumElements(); elemNdx++)
	{
		ConstValueRangeAccess	dst		= valueRange.asAccess().component(elemNdx);
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elemNdx); // \todo [2011-03-25 pyry] Commutative: randomize inputs
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elemNdx);

		// Just pass undefined ranges
		if ((baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT) && isUndefinedValueRange(dst))
		{
			a.getMin() = dst.getMin().value();
			b.getMin() = dst.getMin().value();
			a.getMax() = dst.getMax().value();
			b.getMax() = dst.getMax().value();
			continue;
		}

		if (baseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asFloat(), dst.getMax().asFloat(),
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (baseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asInt(), dst.getMax().asInt(),
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(baseType == VariableType::TYPE_BOOL);
			ComputeValueRange()(state.getRandom(), dst.getMin().asBool(), dst.getMax().asBool(),
								a.getMin().asBool(), a.getMax().asBool(),
								b.getMin().asBool(), b.getMax().asBool());
		}
	}
}